

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse.c
# Opt level: O1

void test_read_format_gtar_sparse(void)

{
  archive_contents *in_RSI;
  
  verify_archive_file("test_read_format_gtar_sparse_1_13.tar",in_RSI);
  verify_archive_file("test_read_format_gtar_sparse_1_17.tar",in_RSI);
  verify_archive_file("test_read_format_gtar_sparse_1_17_posix00.tar",in_RSI);
  verify_archive_file("test_read_format_gtar_sparse_1_17_posix01.tar",in_RSI);
  verify_archive_file("test_read_format_gtar_sparse_1_17_posix10.tar",in_RSI);
  verify_archive_file("test_read_format_gtar_sparse_1_17_posix10_modified.tar",in_RSI);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_sparse)
{
	/* Two archives that use the "GNU tar sparse format". */
	verify_archive_file("test_read_format_gtar_sparse_1_13.tar", files);
	verify_archive_file("test_read_format_gtar_sparse_1_17.tar", files);

	/*
	 * libarchive < 1.9 doesn't support the newer --posix sparse formats
	 * from GNU tar 1.15 and later.
	 */

	/*
	 * An archive created by GNU tar 1.17 using --posix --sparse-format=0.1
	 */
	verify_archive_file(
		"test_read_format_gtar_sparse_1_17_posix00.tar",
		files);
	/*
	 * An archive created by GNU tar 1.17 using --posix --sparse-format=0.1
	 */
	verify_archive_file(
		"test_read_format_gtar_sparse_1_17_posix01.tar",
		files);
	/*
	 * An archive created by GNU tar 1.17 using --posix --sparse-format=1.0
	 */
	verify_archive_file(
		"test_read_format_gtar_sparse_1_17_posix10.tar",
		files);
	/*
	 * The last test archive here is a little odd.  First, it's
	 * uncompressed, because that exercises some of the block
	 * reassembly code a little harder.  Second, it includes some
	 * leading comments prior to the sparse block description.
	 * GNU tar doesn't do this, but I think it should, so I want
	 * to ensure that libarchive correctly ignores such comments.
	 * Dump the file, looking for "#!gnu-sparse-format" starting
	 * at byte 0x600.
	 */
	verify_archive_file(
		"test_read_format_gtar_sparse_1_17_posix10_modified.tar",
		files);
}